

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_decompress_symbolic.cpp
# Opt level: O1

void decompress_symbolic_block
               (astcenc_profile decode_mode,block_size_descriptor *bsd,int xpos,int ypos,int zpos,
               symbolic_compressed_block *scb,image_block *blk)

{
  undefined4 uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint8_t uVar17;
  int iVar18;
  uint uVar19;
  undefined4 uVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t (*pauVar23) [216];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM11 [64];
  vint4 ep1;
  vint4 ep0;
  int plane2_weights [216];
  int plane1_weights [216];
  bool local_7ea;
  bool local_7e9;
  partition_info *local_7e8;
  ulong local_7e0;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7c8;
  undefined4 uStack_7c4;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_7a8;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_748;
  undefined4 uStack_744;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  vint4 local_718;
  vint4 local_708;
  int local_6f8 [216];
  int local_398 [218];
  
  blk->xpos = xpos;
  blk->ypos = ypos;
  blk->zpos = zpos;
  blk->grayscale = false;
  (blk->data_min).m[0] = 0.0;
  (blk->data_min).m[1] = 0.0;
  (blk->data_min).m[2] = 0.0;
  (blk->data_min).m[3] = 0.0;
  (blk->data_mean).m[0] = 0.0;
  (blk->data_mean).m[1] = 0.0;
  (blk->data_mean).m[2] = 0.0;
  (blk->data_mean).m[3] = 0.0;
  (blk->data_mean).m[0] = 0.0;
  (blk->data_mean).m[1] = 0.0;
  (blk->data_mean).m[2] = 0.0;
  (blk->data_mean).m[3] = 0.0;
  (blk->data_max).m[0] = 0.0;
  (blk->data_max).m[1] = 0.0;
  (blk->data_max).m[2] = 0.0;
  (blk->data_max).m[3] = 0.0;
  uVar17 = scb->block_type;
  auVar25 = in_ZMM1._0_16_;
  if (uVar17 == '\x02') {
    auVar27 = *(undefined1 (*) [16])&scb->field_9;
    auVar31 = vpsrad_avx(auVar27,8);
    auVar30 = vpand_avx(auVar27,_DAT_00332450);
    auVar25 = vpcmpeqd_avx(auVar25,auVar25);
    auVar34 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    if (blk->decode_unorm8 == false) {
      auVar34 = (undefined1  [16])0x0;
    }
    auVar30 = vpaddd_avx(auVar31,auVar30);
    if (decode_mode != ASTCENC_PRF_LDR_SRGB) {
      auVar25 = auVar34;
    }
    auVar27 = vpblendvb_avx(auVar27,auVar30,auVar25);
    auVar25 = vpsrld_avx(auVar27,8);
    auVar25 = vpandn_avx(auVar25,auVar27);
    auVar25 = vcvtdq2ps_avx(auVar25);
    auVar30._8_4_ = 0x9e;
    auVar30._0_8_ = 0x9e0000009e;
    auVar30._12_4_ = 0x9e;
    auVar25 = vpsrld_avx(auVar25,0x17);
    auVar25 = vpsubd_avx(auVar30,auVar25);
    auVar25 = vpmaxsd_avx(auVar25,(undefined1  [16])0x0);
    auVar34._8_4_ = 0x20;
    auVar34._0_8_ = 0x2000000020;
    auVar34._12_4_ = 0x20;
    auVar36._8_4_ = 3;
    auVar36._0_8_ = 0x300000003;
    auVar36._12_4_ = 3;
    auVar31 = vpminsd_avx(auVar25,auVar34);
    auVar34 = vpcmpgtd_avx(auVar27,auVar36);
    auVar25._8_4_ = 0xffff;
    auVar25._0_8_ = 0xffff0000ffff;
    auVar25._12_4_ = 0xffff;
    auVar30 = vpcmpeqd_avx(auVar27,auVar25);
    auVar25 = vpslld_avx(auVar31,0x17);
    auVar32._8_4_ = 0x38000000;
    auVar32._0_8_ = 0x3800000038000000;
    auVar32._12_4_ = 0x38000000;
    auVar25 = vpaddd_avx(auVar25,auVar32);
    auVar28._0_4_ = (int)auVar25._0_4_;
    auVar28._4_4_ = (int)auVar25._4_4_;
    auVar28._8_4_ = (int)auVar25._8_4_;
    auVar28._12_4_ = (int)auVar25._12_4_;
    auVar25 = vpmulld_avx(auVar28,auVar27);
    auVar25 = vpsrld_avx(auVar25,6);
    auVar31 = vpslld_avx(auVar31,10);
    auVar33._8_4_ = 0x3ff;
    auVar33._0_8_ = 0x3ff000003ff;
    auVar33._12_4_ = 0x3ff;
    auVar25 = vpand_avx(auVar25,auVar33);
    auVar25 = vpsubd_avx(auVar25,auVar31);
    auVar31._8_4_ = 0x7800;
    auVar31._0_8_ = 0x780000007800;
    auVar31._12_4_ = 0x7800;
    auVar25 = vpaddd_avx(auVar25,auVar31);
    auVar40._8_4_ = 0x3c00;
    auVar40._0_8_ = 0x3c0000003c00;
    auVar40._12_4_ = 0x3c00;
    auVar25 = vblendvps_avx(auVar25,auVar40,auVar30);
    auVar27 = vpslld_avx(auVar27,8);
    auVar25 = vblendvps_avx(auVar27,auVar25,auVar34);
    uVar17 = '\0';
  }
  else {
    if (uVar17 != '\x01') {
      if (uVar17 == '\0') {
        if (bsd->texel_count == '\0') {
          return;
        }
        uVar21 = 0;
        do {
          blk->data_r[uVar21] = -NAN;
          blk->data_g[uVar21] = -NAN;
          blk->data_b[uVar21] = -NAN;
          blk->data_a[uVar21] = -NAN;
          blk->rgb_lns[uVar21] = '\0';
          blk->alpha_lns[uVar21] = '\0';
          uVar21 = uVar21 + 1;
        } while (uVar21 < bsd->texel_count);
        return;
      }
      local_7e0 = (ulong)scb->partition_count;
      auVar27 = in_ZMM11._0_16_;
      local_7e8 = block_size_descriptor::get_partition_info
                            (bsd,(uint)scb->partition_count,(uint)scb->partition_index);
      uVar4 = bsd->block_mode_packed_index[scb->block_mode];
      if ((uVar4 != 0xffff) &&
         ((uint)uVar4 <= bsd->block_mode_count_all && bsd->block_mode_count_all != (uint)uVar4)) {
        unpack_weights(bsd,scb,bsd->decimation_tables + bsd->block_modes[uVar4].decimation_mode,
                       (bool)(bsd->block_modes[uVar4].field_0x5 & 1),local_398,local_6f8);
        if (local_7e0 == 0) {
          return;
        }
        iVar18 = (int)scb->plane2_component;
        local_788 = vpcmpeqd_avx(auVar27,auVar27);
        auVar25 = vpcmpeqd_avx(auVar25,auVar25);
        if (blk->decode_unorm8 == false) {
          auVar25 = (undefined1  [16])0x0;
        }
        auVar27._4_4_ = iVar18;
        auVar27._0_4_ = iVar18;
        auVar27._8_4_ = iVar18;
        auVar27._12_4_ = iVar18;
        if (decode_mode != ASTCENC_PRF_LDR_SRGB) {
          local_788 = auVar25;
        }
        pauVar23 = local_7e8->texels_of_partition;
        uVar21 = 0;
        local_798 = vpcmpeqd_avx(auVar27,_DAT_0027d3d0);
        local_7d8 = 3;
        uStack_7d4 = 3;
        uStack_7d0 = 3;
        uStack_7cc = 3;
        local_728 = 0xffff;
        uStack_724 = 0xffff;
        uStack_720 = 0xffff;
        uStack_71c = 0xffff;
        local_738 = 0x38000000;
        uStack_734 = 0x38000000;
        uStack_730 = 0x38000000;
        uStack_72c = 0x38000000;
        local_748 = 0x3ff;
        uStack_744 = 0x3ff;
        uStack_740 = 0x3ff;
        uStack_73c = 0x3ff;
        local_758 = 0x7ff;
        uStack_754 = 0x7ff;
        uStack_750 = 0x7ff;
        uStack_74c = 0x7ff;
        local_768 = 0x1ff;
        uStack_764 = 0x1ff;
        uStack_760 = 0x1ff;
        uStack_75c = 0x1ff;
        local_778 = 0xfffffe00;
        uStack_774 = 0xfffffe00;
        uStack_770 = 0xfffffe00;
        uStack_76c = 0xfffffe00;
        local_7a8 = 0x40;
        uStack_7a4 = 0x40;
        uStack_7a0 = 0x40;
        uStack_79c = 0x40;
        local_7b8 = 0x20;
        uStack_7b4 = 0x20;
        uStack_7b0 = 0x20;
        uStack_7ac = 0x20;
        local_7c8 = 0x9e;
        uStack_7c4 = 0x9e;
        uStack_7c0 = 0x9e;
        uStack_7bc = 0x9e;
        do {
          unpack_color_endpoints
                    (decode_mode,(uint)scb->color_formats[uVar21],
                     scb->color_formats + uVar21 * 8 + 0xc,&local_7e9,&local_7ea,&local_708,
                     &local_718);
          auVar8._4_4_ = uStack_7c4;
          auVar8._0_4_ = local_7c8;
          auVar8._8_4_ = uStack_7c0;
          auVar8._12_4_ = uStack_7bc;
          auVar9._4_4_ = uStack_7b4;
          auVar9._0_4_ = local_7b8;
          auVar9._8_4_ = uStack_7b0;
          auVar9._12_4_ = uStack_7ac;
          auVar10._4_4_ = uStack_7a4;
          auVar10._0_4_ = local_7a8;
          auVar10._8_4_ = uStack_7a0;
          auVar10._12_4_ = uStack_79c;
          bVar2 = local_7e8->partition_texel_count[uVar21];
          if ((ulong)bVar2 != 0) {
            uVar19 = -(uint)local_7e9;
            auVar25 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
            auVar25 = vpinsrd_avx(auVar25,uVar19,2);
            auVar25 = vpinsrd_avx(auVar25,-(uint)local_7ea,3);
            uVar20 = vmovmskps_avx(auVar25);
            uVar22 = 0;
            do {
              bVar3 = (*pauVar23)[uVar22];
              uVar1 = *(undefined4 *)((long)local_398 + (ulong)((uint)bVar3 * 4));
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_6f8 + (ulong)((uint)bVar3 * 4));
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar27 = vblendvps_avx(auVar26,auVar29,local_798);
              auVar30 = vpsubd_avx(auVar10,auVar27);
              auVar30 = vpmulld_avx(auVar30,(undefined1  [16])local_708.m);
              auVar27 = vpmulld_avx(auVar27,(undefined1  [16])local_718.m);
              auVar27 = vpaddd_avx(auVar9,auVar27);
              auVar27 = vpaddd_avx(auVar27,auVar30);
              auVar30 = vpsrad_avx(auVar27,6);
              auVar27 = vpsrad_avx(auVar27,0xe);
              auVar34 = vpslld_avx(auVar27,8);
              auVar27 = vpaddd_avx(auVar27,auVar34);
              auVar30 = vpblendvb_avx(auVar30,auVar27,local_788);
              auVar27 = (undefined1  [16])0x0;
              auVar34 = (undefined1  [16])0x0;
              if ((char)uVar20 != '\0') {
                auVar13._4_4_ = uStack_754;
                auVar13._0_4_ = local_758;
                auVar13._8_4_ = uStack_750;
                auVar13._12_4_ = uStack_74c;
                auVar36 = vpand_avx(auVar30,auVar13);
                auVar6._4_4_ = uStack_7d4;
                auVar6._0_4_ = local_7d8;
                auVar6._8_4_ = uStack_7d0;
                auVar6._12_4_ = uStack_7cc;
                auVar40 = vpmaddwd_avx(auVar36,auVar6);
                auVar34 = vpslld_avx(auVar36,2);
                auVar11._4_4_ = uStack_774;
                auVar11._0_4_ = local_778;
                auVar11._8_4_ = uStack_770;
                auVar11._12_4_ = uStack_76c;
                auVar34 = vpaddd_avx(auVar34,auVar11);
                auVar39._8_4_ = 0x5ff;
                auVar39._0_8_ = 0x5ff000005ff;
                auVar39._12_4_ = 0x5ff;
                auVar28 = vpcmpgtd_avx(auVar36,auVar39);
                auVar41._8_2_ = 5;
                auVar41._0_8_ = 0x5000500050005;
                auVar41._10_2_ = 5;
                auVar41._12_2_ = 5;
                auVar41._14_2_ = 5;
                auVar44._8_4_ = 0xfffff800;
                auVar44._0_8_ = 0xfffff800fffff800;
                auVar44._12_4_ = 0xfffff800;
                auVar31 = vpmaddwd_avx(auVar41,auVar36);
                auVar31 = vpaddd_avx(auVar31,auVar44);
                auVar34 = vblendvps_avx(auVar34,auVar31,auVar28);
                auVar12._4_4_ = uStack_764;
                auVar12._0_4_ = local_768;
                auVar12._8_4_ = uStack_760;
                auVar12._12_4_ = uStack_75c;
                auVar31 = vpcmpgtd_avx(auVar36,auVar12);
                auVar34 = vblendvps_avx(auVar40,auVar34,auVar31);
                auVar36 = vpsrld_avx(auVar30,1);
                auVar31 = vpsrld_avx(auVar34,3);
                auVar38._8_4_ = 0x7ffffc00;
                auVar38._0_8_ = 0x7ffffc007ffffc00;
                auVar38._12_4_ = 0x7ffffc00;
                auVar34 = vpand_avx(auVar36,auVar38);
                auVar34 = vpor_avx(auVar31,auVar34);
                auVar37._8_4_ = 0x7bff;
                auVar37._0_8_ = 0x7bff00007bff;
                auVar37._12_4_ = 0x7bff;
                auVar34 = vpminsd_avx(auVar34,auVar37);
              }
              if ((char)uVar20 != '\x0f') {
                auVar27 = vpsrld_avx(auVar30,8);
                auVar27 = vpandn_avx(auVar27,auVar30);
                auVar27 = vcvtdq2ps_avx(auVar27);
                auVar27 = vpsrld_avx(auVar27,0x17);
                auVar27 = vpsubd_avx(auVar8,auVar27);
                auVar27 = vpmaxsd_avx(auVar27,_DAT_0027d060);
                auVar28 = vpminsd_avx(auVar27,auVar9);
                auVar7._4_4_ = uStack_7d4;
                auVar7._0_4_ = local_7d8;
                auVar7._8_4_ = uStack_7d0;
                auVar7._12_4_ = uStack_7cc;
                auVar36 = vpcmpgtd_avx(auVar30,auVar7);
                auVar16._4_4_ = uStack_724;
                auVar16._0_4_ = local_728;
                auVar16._8_4_ = uStack_720;
                auVar16._12_4_ = uStack_71c;
                auVar31 = vpcmpeqd_avx(auVar30,auVar16);
                auVar40 = vpslld_avx(auVar30,8);
                auVar27 = vpslld_avx(auVar28,0x17);
                auVar15._4_4_ = uStack_734;
                auVar15._0_4_ = local_738;
                auVar15._8_4_ = uStack_730;
                auVar15._12_4_ = uStack_72c;
                auVar27 = vpaddd_avx(auVar27,auVar15);
                auVar42._0_4_ = (int)auVar27._0_4_;
                auVar42._4_4_ = (int)auVar27._4_4_;
                auVar42._8_4_ = (int)auVar27._8_4_;
                auVar42._12_4_ = (int)auVar27._12_4_;
                auVar27 = vpmulld_avx(auVar42,auVar30);
                auVar27 = vpsrld_avx(auVar27,6);
                auVar14._4_4_ = uStack_744;
                auVar14._0_4_ = local_748;
                auVar14._8_4_ = uStack_740;
                auVar14._12_4_ = uStack_73c;
                auVar27 = vpand_avx(auVar27,auVar14);
                auVar30 = vpslld_avx(auVar28,10);
                auVar43._8_4_ = 0x7800;
                auVar43._0_8_ = 0x780000007800;
                auVar43._12_4_ = 0x7800;
                auVar27 = vpsubd_avx(auVar27,auVar30);
                auVar27 = vpaddd_avx(auVar43,auVar27);
                auVar35._8_4_ = 0x3c00;
                auVar35._0_8_ = 0x3c0000003c00;
                auVar35._12_4_ = 0x3c00;
                auVar27 = vblendvps_avx(auVar27,auVar35,auVar31);
                auVar27 = vblendvps_avx(auVar40,auVar27,auVar36);
              }
              auVar27 = vpblendvb_avx(auVar27,auVar34,auVar25);
              auVar27 = vpackssdw_avx(auVar27,auVar27);
              auVar27 = vcvtph2ps_f16c(auVar27);
              blk->data_r[bVar3] = auVar27._0_4_;
              fVar5 = (float)vextractps_avx(auVar27,1);
              blk->data_g[bVar3] = fVar5;
              fVar5 = (float)vextractps_avx(auVar27,2);
              blk->data_b[bVar3] = fVar5;
              fVar5 = (float)vextractps_avx(auVar27,3);
              blk->data_a[bVar3] = fVar5;
              uVar22 = uVar22 + 1;
            } while (bVar2 != uVar22);
          }
          uVar21 = uVar21 + 1;
          pauVar23 = pauVar23 + 1;
        } while (uVar21 != local_7e0);
        return;
      }
      __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                    ,0x27f,
                    "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const");
    }
    if ((decode_mode & ~ASTCENC_PRF_LDR) != ASTCENC_PRF_HDR_RGB_LDR_A) {
      auVar24._8_4_ = 0xffffe000;
      auVar24._0_8_ = 0xffffe000ffffe000;
      auVar24._12_4_ = 0xffffe000;
      uVar17 = '\0';
      goto LAB_002701ea;
    }
    auVar25 = *(undefined1 (*) [16])&scb->field_9;
    uVar17 = '\x01';
  }
  auVar25 = vpackssdw_avx(auVar25,auVar25);
  auVar24 = vcvtph2ps_f16c(auVar25);
LAB_002701ea:
  if (bsd->texel_count != '\0') {
    auVar25 = vmovshdup_avx(auVar24);
    auVar27 = vshufpd_avx(auVar24,auVar24,1);
    auVar30 = vshufps_avx(auVar24,auVar24,0xff);
    uVar21 = 0;
    do {
      blk->data_r[uVar21] = auVar24._0_4_;
      blk->data_g[uVar21] = auVar25._0_4_;
      blk->data_b[uVar21] = auVar27._0_4_;
      blk->data_a[uVar21] = auVar30._0_4_;
      blk->rgb_lns[uVar21] = uVar17;
      blk->alpha_lns[uVar21] = uVar17;
      uVar21 = uVar21 + 1;
    } while (uVar21 < bsd->texel_count);
  }
  return;
}

Assistant:

void decompress_symbolic_block(
	astcenc_profile decode_mode,
	const block_size_descriptor& bsd,
	int xpos,
	int ypos,
	int zpos,
	const symbolic_compressed_block& scb,
	image_block& blk
) {
	blk.xpos = xpos;
	blk.ypos = ypos;
	blk.zpos = zpos;

	blk.data_min = vfloat4::zero();
	blk.data_mean = vfloat4::zero();
	blk.data_max = vfloat4::zero();
	blk.grayscale = false;

	// If we detected an error-block, blow up immediately.
	if (scb.block_type == SYM_BTYPE_ERROR)
	{
		for (unsigned int i = 0; i < bsd.texel_count; i++)
		{
			blk.data_r[i] = error_color_nan();
			blk.data_g[i] = error_color_nan();
			blk.data_b[i] = error_color_nan();
			blk.data_a[i] = error_color_nan();
			blk.rgb_lns[i] = 0;
			blk.alpha_lns[i] = 0;
		}

		return;
	}

	if ((scb.block_type == SYM_BTYPE_CONST_F16) ||
	    (scb.block_type == SYM_BTYPE_CONST_U16))
	{
		vfloat4 color;
		uint8_t use_lns = 0;

		// UNORM16 constant color block
		if (scb.block_type == SYM_BTYPE_CONST_U16)
		{
			vint4 colori(scb.constant_color);

			// Determine the UNORM8 rounding on the decode
			vmask4 u8_mask = get_u8_component_mask(decode_mode, blk);

			// The real decoder would just use the top 8 bits, but we rescale
			// in to a 16-bit value that rounds correctly.
			vint4 colori_u8 = asr<8>(colori) * 257;
			colori = select(colori, colori_u8, u8_mask);

			vint4 colorf16 = unorm16_to_sf16(colori);
			color = float16_to_float(colorf16);
		}
		// FLOAT16 constant color block
		else
		{
			switch (decode_mode)
			{
			case ASTCENC_PRF_LDR_SRGB:
			case ASTCENC_PRF_LDR:
				color = vfloat4(error_color_nan());
				break;
			case ASTCENC_PRF_HDR_RGB_LDR_A:
			case ASTCENC_PRF_HDR:
				// Constant-color block; unpack from FP16 to FP32.
				color = float16_to_float(vint4(scb.constant_color));
				use_lns = 1;
				break;
			}
		}

		for (unsigned int i = 0; i < bsd.texel_count; i++)
		{
			blk.data_r[i] = color.lane<0>();
			blk.data_g[i] = color.lane<1>();
			blk.data_b[i] = color.lane<2>();
			blk.data_a[i] = color.lane<3>();
			blk.rgb_lns[i] = use_lns;
			blk.alpha_lns[i] = use_lns;
		}

		return;
	}

	// Get the appropriate partition-table entry
	int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	// Get the appropriate block descriptors
	const auto& bm = bsd.get_block_mode(scb.block_mode);
	const auto& di = bsd.get_decimation_info(bm.decimation_mode);

	bool is_dual_plane = static_cast<bool>(bm.is_dual_plane);

	// Unquantize and undecimate the weights
	int plane1_weights[BLOCK_MAX_TEXELS];
	int plane2_weights[BLOCK_MAX_TEXELS];
	unpack_weights(bsd, scb, di, is_dual_plane, plane1_weights, plane2_weights);

	// Now that we have endpoint colors and weights, we can unpack texel colors
	int plane2_component = scb.plane2_component;
	vmask4 plane2_mask = vint4::lane_id() == vint4(plane2_component);

	vmask4 u8_mask = get_u8_component_mask(decode_mode, blk);

	for (int i = 0; i < partition_count; i++)
	{
		// Decode the color endpoints for this partition
		vint4 ep0;
		vint4 ep1;
		bool rgb_lns;
		bool a_lns;

		unpack_color_endpoints(decode_mode,
		                       scb.color_formats[i],
		                       scb.color_values[i],
		                       rgb_lns, a_lns,
		                       ep0, ep1);

		vmask4 lns_mask(rgb_lns, rgb_lns, rgb_lns, a_lns);

		int texel_count = pi.partition_texel_count[i];
		for (int j = 0; j < texel_count; j++)
		{
			int tix = pi.texels_of_partition[i][j];
			vint4 weight = select(vint4(plane1_weights[tix]), vint4(plane2_weights[tix]), plane2_mask);
			vint4 color = lerp_color_int(u8_mask, ep0, ep1, weight);
			vfloat4 colorf = decode_texel(color, lns_mask);

			blk.data_r[tix] = colorf.lane<0>();
			blk.data_g[tix] = colorf.lane<1>();
			blk.data_b[tix] = colorf.lane<2>();
			blk.data_a[tix] = colorf.lane<3>();
		}
	}
}